

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

bool tinyusdz::anon_unknown_160::ExtractVariantsRec
               (uint32_t depth,string *root_path,Prim *prim,Dictionary *dict,uint32_t max_depth,
               string *err)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  value_type *pvVar3;
  pointer pPVar4;
  bool bVar5;
  long *plVar6;
  PrimMeta *pPVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  size_type *psVar11;
  char *pcVar12;
  value_type *__x;
  undefined4 in_register_00000084;
  Prim *child;
  pointer prim_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Dictionary vsetdict;
  Dictionary values;
  string full_prim_path;
  Dictionary variantInfos;
  storage_union local_148;
  vtable_type *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  undefined8 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  char *local_110;
  Prim *local_108;
  uint32_t local_fc;
  Dictionary *local_f8;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  pointer pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Base_ptr local_98;
  size_t local_90;
  key_type local_88;
  _Rb_tree_node_base *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_60;
  
  pcVar12 = (char *)CONCAT44(in_register_00000084,max_depth);
  local_fc = depth;
  if (depth < 0x100001) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((prim->_elementPath)._prim_part._M_string_length == 0) {
      if (pcVar12 != (char *)0x0) {
        ::std::__cxx11::string::append(pcVar12);
      }
      bVar5 = false;
    }
    else {
      pcVar2 = (root_path->_M_dataplus)._M_p;
      local_148.dynamic = &local_138;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar2,pcVar2 + root_path->_M_string_length);
      ::std::__cxx11::string::append((char *)&local_148);
      plVar6 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)&local_148,
                                  (ulong)(prim->_elementPath)._prim_part._M_dataplus._M_p);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_88.field_2._M_allocated_capacity = *psVar11;
        local_88.field_2._8_8_ = plVar6[3];
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar11;
        local_88._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((vtable_type **)local_148.dynamic != &local_138) {
        operator_delete(local_148.dynamic,(ulong)((long)&local_138->type_id + 1));
      }
      pPVar7 = Prim::metas(prim);
      local_110 = pcVar12;
      local_108 = prim;
      local_f8 = dict;
      if ((pPVar7->variantSets).has_value_ == true) {
        pPVar7 = Prim::metas(prim);
        if ((pPVar7->variantSets).has_value_ == false) {
          pcVar12 = 
          "const value_type &nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>>::value() const [T = std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>]"
          ;
          goto LAB_001b383d;
        }
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)&local_148,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(pPVar7->variantSets).contained + 8));
        local_f0._0_8_ = &local_e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"variantSets","");
        pmVar8 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_60,(key_type *)local_f0);
        ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
        linb::any::operator=((any *)pmVar8,(any *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != &local_e0) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        dict = local_f8;
        prim = local_108;
        pcVar12 = local_110;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
        }
      }
      pPVar7 = Prim::metas(prim);
      if ((pPVar7->variants).has_value_ == true) {
        local_a8._8_8_ = &pbStack_b0;
        pbStack_b0 = (pointer)((ulong)pbStack_b0 & 0xffffffff00000000);
        local_a8._M_allocated_capacity = 0;
        local_90 = 0;
        local_98 = (_Base_ptr)local_a8._8_8_;
        pPVar7 = Prim::metas(prim);
        if ((pPVar7->variants).has_value_ == false) {
          pcVar12 = 
          "const value_type &nonstd::optional_lite::optional<std::map<std::basic_string<char>, std::basic_string<char>>>::value() const [T = std::map<std::basic_string<char>, std::basic_string<char>>]"
          ;
          goto LAB_001b383d;
        }
        p_Var9 = *(_Rb_tree_node_base **)((long)&(pPVar7->variants).contained + 0x18);
        p_Var10 = (_Rb_tree_node_base *)((long)&(pPVar7->variants).contained + 8);
        if (p_Var9 != p_Var10) {
          local_68 = p_Var10;
          do {
            local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_148.dynamic = (void *)0x0;
            local_128 = 0;
            local_120._M_local_buf[0] = '\0';
            local_130 = &local_120;
            MetaVariable::set_value<std::__cxx11::string>
                      ((MetaVariable *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 2));
            local_e0._M_allocated_capacity =
                 (size_type)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_f0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
            local_e0._8_8_ = &local_c8;
            MetaVariable::set_value<std::__cxx11::string>
                      ((MetaVariable *)local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 2));
            pmVar8 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                   *)local_b8,(key_type *)(p_Var9 + 1));
            ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
            linb::any::operator=((any *)pmVar8,(any *)local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._8_8_ != &local_c8) {
              operator_delete((void *)local_e0._8_8_,local_c8._M_allocated_capacity + 1);
            }
            if ((_Link_type)local_e0._M_allocated_capacity != (_Link_type)0x0) {
              (**(code **)((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                            *)(local_e0._M_allocated_capacity + 0x20))->_M_storage)(local_f0);
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,
                              CONCAT71(local_120._M_allocated_capacity._1_7_,
                                       local_120._M_local_buf[0]) + 1);
            }
            if (local_138 != (vtable_type *)0x0) {
              (*local_138->destroy)(&local_148);
            }
            p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != local_68);
        }
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_148,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_b8);
        local_f0._0_8_ = &local_e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"variants","");
        pmVar8 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_60,(key_type *)local_f0);
        ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
        linb::any::operator=((any *)pmVar8,(any *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != &local_e0) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
        }
        dict = local_f8;
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        prim = local_108;
        pcVar12 = local_110;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_b8,(_Link_type)local_a8._M_allocated_capacity);
      }
      pPVar7 = Prim::metas(prim);
      if ((pPVar7->variantSetChildren).has_value_ == true) {
        pPVar7 = Prim::metas(prim);
        if ((pPVar7->variantSetChildren).has_value_ == false) {
          pcVar12 = 
          "const value_type &nonstd::optional_lite::optional<std::vector<tinyusdz::Token>>::value() const [T = std::vector<tinyusdz::Token>]"
          ;
LAB_001b383d:
          __assert_fail("has_value()",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                        ,0x584,pcVar12);
        }
        local_b8 = (undefined1  [8])0x0;
        pbStack_b0 = (pointer)0x0;
        local_a8._M_allocated_capacity = 0;
        __x = *(value_type **)&(pPVar7->variantSetChildren).contained;
        pvVar3 = *(value_type **)((long)&(pPVar7->variantSetChildren).contained + 8);
        if (__x != pvVar3) {
LAB_001b3318:
          if (__x->_M_string_length != 0) goto code_r0x001b3323;
          if (pcVar12 != (char *)0x0) {
            ::std::__cxx11::string::append(pcVar12);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
LAB_001b37ae:
          bVar5 = false;
          goto LAB_001b37b0;
        }
LAB_001b3337:
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)&local_148,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8);
        local_f0._0_8_ = &local_e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"variantSet","");
        pmVar8 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_60,(key_type *)local_f0);
        ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
        linb::any::operator=((any *)pmVar8,(any *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != &local_e0) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._M_allocated_capacity + 1));
        }
        dict = local_f8;
        prim = local_108;
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        pcVar12 = local_110;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
      }
      else if ((prim->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_e0._8_8_ = local_f0 + 8;
        local_f0._8_4_ = 0;
        local_e0._M_allocated_capacity = 0;
        local_c8._M_allocated_capacity = 0;
        p_Var9 = (prim->_variantSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(prim->_variantSets)._M_t._M_impl.super__Rb_tree_header;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_e0._8_8_;
        if ((_Rb_tree_header *)p_Var9 != p_Var1) {
          do {
            if (p_Var9[4]._M_parent != (_Base_ptr)0x0) {
              local_b8 = (undefined1  [8])0x0;
              pbStack_b0 = (pointer)0x0;
              local_a8._M_allocated_capacity = 0;
              if (p_Var9[2]._M_parent == (_Base_ptr)0x0) {
                if (local_110 != (char *)0x0) {
                  ::std::__cxx11::string::append(local_110);
                }
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_b8);
                ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            *)local_f0,(_Link_type)local_e0._M_allocated_capacity);
                goto LAB_001b37ae;
              }
              for (p_Var10 = p_Var9[3]._M_right;
                  p_Var10 != (_Rb_tree_node_base *)&p_Var9[3]._M_parent;
                  p_Var10 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var10)) {
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_b8,(value_type *)(p_Var10 + 1));
              }
              local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
              local_148.dynamic = (vtable_type **)0x0;
              local_128 = 0;
              local_120._M_local_buf[0] = '\0';
              local_130 = &local_120;
              MetaVariable::
              set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((MetaVariable *)&local_148,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_b8);
              pmVar8 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                     *)local_f0,(key_type *)(p_Var9 + 1));
              ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
              linb::any::operator=((any *)pmVar8,(any *)&local_148);
              if (local_130 != &local_120) {
                operator_delete(local_130,
                                CONCAT71(local_120._M_allocated_capacity._1_7_,
                                         local_120._M_local_buf[0]) + 1);
              }
              dict = local_f8;
              if (local_138 != (vtable_type *)0x0) {
                (*local_138->destroy)(&local_148);
              }
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_b8);
            }
            p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var1);
          pcVar12 = local_110;
          prim = local_108;
          if (local_c8._M_allocated_capacity != 0) {
            local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_148.dynamic = (vtable_type **)0x0;
            local_130 = &local_120;
            local_128 = 0;
            local_120._M_local_buf[0] = '\0';
            MetaVariable::
            set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                      ((MetaVariable *)&local_148,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                        *)local_f0);
            local_b8 = (undefined1  [8])&local_a8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"variantSet","");
            pmVar8 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                   *)&local_60,(key_type *)local_b8);
            ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
            linb::any::operator=((any *)pmVar8,(any *)&local_148);
            if (local_b8 != (undefined1  [8])&local_a8) {
              operator_delete((void *)local_b8,(ulong)(local_a8._M_allocated_capacity + 1));
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,
                              CONCAT71(local_120._M_allocated_capacity._1_7_,
                                       local_120._M_local_buf[0]) + 1);
            }
            prim = local_108;
            pcVar12 = local_110;
            if (local_138 != (vtable_type *)0x0) {
              (*local_138->destroy)(&local_148);
            }
          }
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_f0,(_Link_type)local_e0._M_allocated_capacity);
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_148,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)&local_60);
        pmVar8 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[](dict,&local_88);
        ::std::__cxx11::string::_M_assign((string *)&pmVar8->_name);
        linb::any::operator=((any *)pmVar8,(any *)&local_148);
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        prim = local_108;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
          prim = local_108;
        }
      }
      prim_00 = (prim->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar4 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (prim_00 == pPVar4) {
        bVar5 = true;
      }
      else {
        local_fc = local_fc + 1;
        do {
          bVar5 = ExtractVariantsRec(local_fc,&local_88,prim_00,dict,(uint32_t)pcVar12,err);
          if (!bVar5) break;
          prim_00 = prim_00 + 1;
        } while (prim_00 != pPVar4);
      }
LAB_001b37b0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  else {
    if (pcVar12 != (char *)0x0) {
      ::std::__cxx11::string::append(pcVar12);
    }
    bVar5 = false;
  }
  return bVar5;
code_r0x001b3323:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8,__x);
  __x = __x + 1;
  if (__x == pvVar3) goto LAB_001b3337;
  goto LAB_001b3318;
}

Assistant:

bool ExtractVariantsRec(uint32_t depth, const std::string &root_path,
                        const Prim &prim, Dictionary &dict,
                        const uint32_t max_depth, std::string *err) {
  if (depth > max_depth) {
    if (err) {
      (*err) += "Too deep\n";
    }
    return false;
  }

  Dictionary variantInfos;

  if (prim.element_name().empty()) {
    if (err) {
      (*err) += "Prim name is empty.\n";
    }
    return false;
  }

  std::string full_prim_path = root_path + "/" + prim.element_name();

  if (prim.metas().variantSets) {
    const std::vector<std::string> &vsets =
        prim.metas().variantSets.value().second;
    MetaVariable var;
    var.set_value(vsets);
    variantInfos["variantSets"] = var;
  }

  if (prim.metas().variants) {
    Dictionary values;

    const VariantSelectionMap &vsmap = prim.metas().variants.value();
    for (const auto &item : vsmap) {
      MetaVariable var;
      var.set_value(item.second);

      values[item.first] = item.second;
    }

    variantInfos["variants"] = values;
  }

  // variantSetChildren Prim metadataum supercedes Prim's variantSets Stmt
  if (prim.metas().variantSetChildren) {
    const std::vector<value::token> &vsets =
        prim.metas().variantSetChildren.value();
    // to string
    std::vector<std::string> vsetchildren;
    for (const auto &item : vsets) {
      if (!item.valid()) {
        if (err) {
          (*err) += "Invalid variantSetChildren token found.\n";
        }
        return false;
      }
      vsetchildren.push_back(item.str());
    }
    variantInfos["variantSet"] = vsetchildren;
  } else if (prim.variantSets().size()) {
    Dictionary vsetdict;

    for (const auto &item : prim.variantSets()) {
      if (item.second.variantSet.size()) {
        std::vector<std::string> variantStmtNames;

        if (item.second.name.empty()) {
          if (err) {
            (*err) += "Invalid variantSets Statements found.\n";
          }
          return false;
        }

        for (const auto &v : item.second.variantSet) {
          variantStmtNames.push_back(v.first);
        }

        vsetdict[item.first] = variantStmtNames;
      }
    }

    if (vsetdict.size()) {
      variantInfos["variantSet"] = vsetdict;
    }
  }

  if (variantInfos.size()) {
    dict[full_prim_path] = variantInfos;
  }

  // Traverse children
  for (const auto &child : prim.children()) {
    if (!ExtractVariantsRec(depth + 1, full_prim_path, child, dict, max_depth,
                            err)) {
      return false;
    }
  }

  return true;
}